

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandIso(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_58;
  int fVerbose;
  int c;
  Vec_Ptr_t *vPosEquivs;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAig = (Aig_Man_t *)0x0;
  _fVerbose = (Vec_Ptr_t *)0x0;
  local_58 = 0;
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"vh");
    if (iVar1 == -1) {
      pNtkNew = Abc_FrameReadNtk(pAStack_18);
      if (pNtkNew == (Abc_Ntk_t *)0x0) {
        Abc_Print(1,"Main AIG: There is no current network.\n");
      }
      else {
        iVar1 = Abc_NtkIsStrash(pNtkNew);
        if (iVar1 == 0) {
          Abc_Print(1,"Main AIG: The current network is not an AIG.\n");
        }
        else {
          iVar1 = Abc_NtkPoNum(pNtkNew);
          if (iVar1 == 1) {
            Abc_Print(1,"Current AIG has only one PO. Transformation is not performed.\n");
          }
          else {
            pTemp = Abc_NtkToDar(pNtkNew,0,1);
            vPosEquivs = (Vec_Ptr_t *)Saig_ManIsoReduce(pTemp,(Vec_Ptr_t **)&fVerbose,local_58);
            pAig = (Aig_Man_t *)Abc_NtkFromAigPhase((Aig_Man_t *)vPosEquivs);
            pcVar2 = Extra_UtilStrsav(pNtkNew->pName);
            pAig->pSpec = pcVar2;
            Aig_ManStop((Aig_Man_t *)vPosEquivs);
            Aig_ManStop(pTemp);
            Abc_FrameReplacePoEquivs(pAStack_18,(Vec_Ptr_t **)&fVerbose);
            Abc_FrameReplaceCurrentNetwork(pAStack_18,(Abc_Ntk_t *)pAig);
          }
        }
      }
      return 0;
    }
    if (iVar1 == 0x68) break;
    if (iVar1 != 0x76) {
      Abc_Print(-2,"Unknown switch.\n");
      break;
    }
    local_58 = local_58 ^ 1;
  }
  Abc_Print(-2,"usage: iso [-vh]\n");
  Abc_Print(-2,"\t         removes POs with isomorphic sequential COI\n");
  pcVar2 = "no";
  if (local_58 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandIso( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkNew = NULL;
    Aig_Man_t * pAig, * pTemp;
    Vec_Ptr_t * vPosEquivs = NULL;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Main AIG: There is no current network.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) == 1 )
    {
        Abc_Print( 1, "Current AIG has only one PO. Transformation is not performed.\n");
        return 0;
    }

    // transform
    pAig = Abc_NtkToDar( pNtk, 0, 1 );
    pTemp = Saig_ManIsoReduce( pAig, &vPosEquivs, fVerbose );
    pNtkNew = Abc_NtkFromAigPhase( pTemp );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    Aig_ManStop( pTemp );
    Aig_ManStop( pAig );

    // update the internal storage of PO equivalences
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );

    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    return 0;

usage:
    Abc_Print( -2, "usage: iso [-vh]\n" );
    Abc_Print( -2, "\t         removes POs with isomorphic sequential COI\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}